

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int in_EAX;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  uint uVar12;
  undefined1 uVar13;
  byte *local_38;
  
  if (ptr == end) {
    return -1;
  }
  bVar4 = false;
  local_38 = (byte *)ptr;
LAB_004d499e:
  bVar2 = local_38[1];
  if (bVar2 < 0xdc) {
    uVar13 = 7;
    if (3 < bVar2 - 0xd8) {
      if (bVar2 == 0) {
        uVar13 = *(undefined1 *)((long)enc[1].scanners + (ulong)*local_38);
      }
      else {
LAB_004d49ec:
        uVar13 = 0x1d;
      }
    }
  }
  else if (bVar2 - 0xdc < 4) {
    uVar13 = 8;
  }
  else {
    if ((bVar2 != 0xff) || (*local_38 < 0xfe)) goto LAB_004d49ec;
    uVar13 = 0;
  }
  switch(uVar13) {
  case 5:
    if ((long)end - (long)local_38 < 2) {
      return -2;
    }
    break;
  case 6:
    if ((long)end - (long)local_38 < 3) {
      return -2;
    }
    break;
  case 7:
    if ((long)end - (long)local_38 < 4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    pbVar7 = local_38;
    do {
      local_38 = pbVar7 + 2;
      iVar9 = 1;
      if (local_38 == (byte *)end) {
        in_EAX = -1;
      }
      else {
        bVar2 = pbVar7[3];
        if (bVar2 < 0xdc) {
          uVar12 = 7;
          if (3 < bVar2 - 0xd8) {
            if (bVar2 == 0) {
              uVar12 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_38);
            }
            else {
LAB_004d4a7d:
              uVar12 = 0x1d;
            }
          }
        }
        else if (bVar2 - 0xdc < 4) {
          uVar12 = 8;
        }
        else if ((bVar2 != 0xff) || (uVar12 = 0, *local_38 < 0xfe)) goto LAB_004d4a7d;
        iVar9 = 6;
        if ((uVar12 != 0xe) &&
           ((0x15 < uVar12 || (iVar9 = 0, (0x200600U >> (uVar12 & 0x1f) & 1) == 0)))) {
          *nextTokPtr = (char *)local_38;
          in_EAX = 0;
          iVar9 = 1;
        }
      }
      pbVar7 = local_38;
    } while (iVar9 == 0);
    if (iVar9 != 6) {
      return in_EAX;
    }
  case 0xe:
    pbVar7 = local_38;
    do {
      local_38 = pbVar7 + 2;
      if (local_38 == (byte *)end) {
        in_EAX = -1;
        goto LAB_004d4b59;
      }
      bVar2 = pbVar7[3];
      if (bVar2 < 0xdc) {
        uVar12 = 7;
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            uVar12 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_38);
          }
          else {
LAB_004d4b22:
            uVar12 = 0x1d;
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        uVar12 = 8;
      }
      else if ((bVar2 != 0xff) || (uVar12 = 0, *local_38 < 0xfe)) goto LAB_004d4b22;
      if ((uVar12 & 0xfffffffe) == 0xc) {
        local_38 = pbVar7 + 4;
        goto LAB_004d4c0b;
      }
    } while ((uVar12 < 0x16) && (pbVar7 = local_38, (0x200600U >> (uVar12 & 0x1f) & 1) != 0));
switchD_004d4f1e_caseD_8:
    pbVar7 = local_38;
    goto LAB_004d4b47;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_004d4a06_caseD_16;
  case 0x17:
    if (bVar4) break;
    pbVar7 = local_38 + 2;
    if (pbVar7 == (byte *)end) {
      return -1;
    }
    bVar2 = local_38[3];
    if (bVar2 < 0xdc) {
      bVar8 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          bVar8 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar7);
        }
        else {
LAB_004d4ddd:
          bVar8 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      bVar8 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (*pbVar7 < 0xfe)) goto LAB_004d4ddd;
      bVar8 = 0;
    }
    if (bVar8 < 0x16) {
      if (bVar8 == 5) {
        if ((long)end - (long)pbVar7 < 2) {
          return -2;
        }
      }
      else if (bVar8 == 6) {
        if ((long)end - (long)pbVar7 < 3) {
          return -2;
        }
      }
      else if ((bVar8 == 7) && ((long)end - (long)pbVar7 < 4)) {
        return -2;
      }
LAB_004d505a:
      *nextTokPtr = (char *)pbVar7;
      return 0;
    }
    if (((bVar8 != 0x16) && (bVar8 != 0x18)) &&
       ((bVar8 != 0x1d ||
        ((*(uint *)((long)namingBitmap +
                   (ulong)(local_38[2] >> 3 & 0x1c |
                          (uint)"\x02\x03\x04\x05\x06\a\b"[local_38[3]] << 5)) >>
          (local_38[2] & 0x1f) & 1) == 0)))) goto LAB_004d505a;
    local_38 = local_38 + 4;
    bVar4 = true;
    goto LAB_004d4b65;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(*local_38 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5))
         >> (*local_38 & 0x1f) & 1) == 0) break;
    goto switchD_004d4a06_caseD_16;
  }
  *nextTokPtr = (char *)local_38;
  return 0;
switchD_004d4a06_caseD_16:
  local_38 = local_38 + 2;
  goto LAB_004d4b65;
LAB_004d4c0b:
  do {
    if (local_38 == (byte *)end) {
      iVar9 = -1;
LAB_004d4c97:
      iVar10 = 1;
    }
    else {
      bVar2 = local_38[1];
      if (bVar2 < 0xdc) {
        uVar5 = 7;
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_38);
          }
          else {
LAB_004d4c6c:
            uVar5 = 0x1d;
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        uVar5 = 8;
      }
      else if ((bVar2 != 0xff) || (uVar5 = 0, *local_38 < 0xfe)) goto LAB_004d4c6c;
      iVar10 = 0xc;
      iVar9 = in_EAX;
      if (uVar5 != uVar12) {
        switch(uVar5) {
        case 0:
        case 1:
        case 2:
        case 8:
          *nextTokPtr = (char *)local_38;
          iVar9 = 0;
          goto LAB_004d4c97;
        case 3:
          iVar6 = little2_scanRef(enc,(char *)(local_38 + 2),end,(char **)&local_38);
          iVar10 = 0;
          if (iVar6 < 1) {
            if (iVar6 == 0) {
              *nextTokPtr = (char *)local_38;
            }
            iVar10 = 1;
            iVar9 = iVar6;
          }
          break;
        default:
switchD_004d4c90_caseD_4:
          local_38 = local_38 + 2;
LAB_004d4cf0:
          iVar10 = 0;
          iVar9 = in_EAX;
          break;
        case 5:
          iVar10 = 1;
          iVar9 = -2;
          if (1 < (long)end - (long)local_38) goto switchD_004d4c90_caseD_4;
          break;
        case 6:
          iVar10 = 1;
          iVar9 = -2;
          if (2 < (long)end - (long)local_38) {
            local_38 = local_38 + 3;
            goto LAB_004d4cf0;
          }
          break;
        case 7:
          iVar10 = 1;
          iVar9 = -2;
          if (3 < (long)end - (long)local_38) {
            local_38 = local_38 + 4;
            goto LAB_004d4cf0;
          }
        }
      }
    }
    in_EAX = iVar9;
  } while (iVar10 == 0);
  if (iVar10 != 0xc) {
    bVar3 = false;
    goto LAB_004d4b5b;
  }
  pbVar7 = local_38 + 2;
  pbVar1 = pbVar7;
  if (pbVar7 == (byte *)end) {
LAB_004d4fb9:
    local_38 = pbVar1;
    bVar3 = false;
    in_EAX = -1;
  }
  else {
    bVar2 = local_38[3];
    if (bVar2 < 0xdc) {
      bVar8 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          bVar8 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar7);
        }
        else {
LAB_004d4e61:
          bVar8 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      bVar8 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (*pbVar7 < 0xfe)) goto LAB_004d4e61;
      bVar8 = 0;
    }
    if (bVar8 < 0x11) {
      if (bVar8 - 9 < 2) {
LAB_004d4ea3:
        local_38 = local_38 + 4;
        pbVar1 = local_38;
        if (local_38 != (byte *)end) {
          pcVar11 = end + (-2 - (long)pbVar7);
LAB_004d4eb6:
          bVar2 = local_38[1];
          if (bVar2 < 0xdc) {
            uVar13 = 7;
            if (3 < bVar2 - 0xd8) {
              if (bVar2 == 0) {
                uVar13 = *(undefined1 *)((long)enc[1].scanners + (ulong)*local_38);
              }
              else {
LAB_004d4f04:
                uVar13 = 0x1d;
              }
            }
          }
          else if (bVar2 - 0xdc < 4) {
            uVar13 = 8;
          }
          else {
            if ((bVar2 != 0xff) || (*local_38 < 0xfe)) goto LAB_004d4f04;
            uVar13 = 0;
          }
          pbVar7 = local_38;
          switch(uVar13) {
          case 5:
            if ((long)pcVar11 < 2) {
LAB_004d4f4b:
              in_EAX = -2;
              goto LAB_004d4b59;
            }
            break;
          case 6:
            if ((long)pcVar11 < 3) goto LAB_004d4f4b;
            break;
          case 7:
            if ((long)pcVar11 < 4) goto LAB_004d4f4b;
            break;
          default:
            goto switchD_004d4f1e_caseD_8;
          case 9:
          case 10:
          case 0x15:
            goto switchD_004d4f1e_caseD_9;
          case 0xb:
            goto LAB_004d4e7c;
          case 0x11:
            goto LAB_004d4f84;
          case 0x16:
          case 0x18:
            goto LAB_004d4ff4;
          case 0x1d:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(*local_38 >> 3 & 0x1c |
                                 (uint)"\x02\x03\x04\x05\x06\a\b"[local_38[1]] << 5)) >>
                 (*local_38 & 0x1f) & 1) == 0) goto LAB_004d4b47;
LAB_004d4ff4:
            local_38 = local_38 + 2;
            bVar3 = true;
            goto LAB_004d4b5b;
          }
          in_EAX = 0;
          *nextTokPtr = (char *)local_38;
          goto LAB_004d4b59;
        }
        goto LAB_004d4fb9;
      }
      local_38 = pbVar7;
      if (bVar8 == 0xb) {
LAB_004d4e7c:
        *nextTokPtr = (char *)(local_38 + 2);
        in_EAX = 1;
LAB_004d4b59:
        bVar3 = false;
        goto LAB_004d4b5b;
      }
    }
    else if (bVar8 == 0x11) {
LAB_004d4f84:
      local_38 = pbVar7;
      pbVar1 = local_38 + 2;
      if (pbVar1 == (byte *)end) goto LAB_004d4fb9;
      pbVar7 = pbVar1;
      if ((local_38[3] == 0) && (*pbVar1 == 0x3e)) {
        *nextTokPtr = (char *)(local_38 + 4);
        in_EAX = 3;
        local_38 = pbVar1;
        goto LAB_004d4b59;
      }
    }
    else if (bVar8 == 0x15) goto LAB_004d4ea3;
LAB_004d4b47:
    local_38 = pbVar7;
    *nextTokPtr = (char *)local_38;
    bVar3 = false;
    in_EAX = 0;
  }
LAB_004d4b5b:
  bVar4 = false;
  if (!bVar3) {
    return in_EAX;
  }
LAB_004d4b65:
  if (local_38 == (byte *)end) {
    return -1;
  }
  goto LAB_004d499e;
switchD_004d4f1e_caseD_9:
  local_38 = local_38 + 2;
  pcVar11 = pcVar11 + -2;
  pbVar1 = local_38;
  if (local_38 == (byte *)end) goto LAB_004d4fb9;
  goto LAB_004d4eb6;
}

Assistant:

static
int PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                     const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          if (ptr == end)
            return XML_TOK_PARTIAL;
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            if (ptr == end)
              return XML_TOK_PARTIAL;
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}